

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::IsEncrypted(WalletBatch *this)

{
  bool bVar1;
  int iVar2;
  pointer pDVar3;
  pointer pDVar4;
  long in_FS_OFFSET;
  DataStream v;
  DataStream k;
  unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> cursor;
  DataStream prefix;
  DataStream *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  byte local_81;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::DataStream(in_stack_ffffffffffffff18);
  DataStream::operator<<
            ((DataStream *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20);
  pDVar3 = std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
           operator->((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       *)in_stack_ffffffffffffff18);
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (DataStream *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  (*pDVar3->_vptr_DatabaseBatch[10])(local_30,pDVar3,local_40,local_38);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
                      *)in_stack_ffffffffffffff18);
  if (bVar1) {
    DataStream::DataStream(in_stack_ffffffffffffff18);
    DataStream::DataStream(in_stack_ffffffffffffff18);
    pDVar4 = std::unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>::
             operator->((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>
                         *)in_stack_ffffffffffffff18);
    iVar2 = (*pDVar4->_vptr_DatabaseCursor[2])(pDVar4,local_60,local_80);
    bVar1 = iVar2 == 1;
    if (bVar1) {
      local_81 = 1;
    }
    DataStream::~DataStream(in_stack_ffffffffffffff18);
    DataStream::~DataStream(in_stack_ffffffffffffff18);
    if (bVar1) goto LAB_002d8e1f;
  }
  bVar1 = false;
LAB_002d8e1f:
  std::unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_>::~unique_ptr
            ((unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> *)
             CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  if (!bVar1) {
    local_81 = 0;
  }
  DataStream::~DataStream(in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_81 & 1);
}

Assistant:

bool WalletBatch::IsEncrypted()
{
    DataStream prefix;
    prefix << DBKeys::MASTER_KEY;
    if (auto cursor = m_batch->GetNewPrefixCursor(prefix)) {
        DataStream k, v;
        if (cursor->Next(k, v) == DatabaseCursor::Status::MORE) return true;
    }
    return false;
}